

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O2

void __thiscall
QOpenGLPixelTransferOptions::setAlignment(QOpenGLPixelTransferOptions *this,int alignment)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  
  pQVar1 = QSharedDataPointer<QOpenGLPixelTransferOptionsData>::operator->(&this->data);
  pQVar1->alignment = alignment;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setAlignment(int alignment)
{
    data->alignment = alignment;
}